

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpositer.cpp
# Opt level: O1

void __thiscall
icu_63::FieldPositionIterator::setData
          (FieldPositionIterator *this,UVector32 *adopt,UErrorCode *status)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  
  if ((adopt != (UVector32 *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    uVar1 = adopt->count;
    if ((ulong)uVar1 == 0) {
      (*(adopt->super_UObject)._vptr_UObject[1])(adopt);
      adopt = (UVector32 *)0x0;
    }
    else if (uVar1 * -0x55555555 + 0x2aaaaaaa < 0x55555555) {
      if (1 < (int)uVar1) {
        uVar2 = 2;
        do {
          iVar3 = 0;
          if (uVar2 < uVar1) {
            iVar3 = adopt->elements[uVar2];
          }
          if (iVar3 <= adopt->elements[uVar2 - 1]) goto LAB_00252c01;
          iVar3 = (int)uVar2;
          uVar2 = uVar2 + 3;
        } while (iVar3 + 2 < (int)uVar1);
      }
    }
    else {
LAB_00252c01:
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->data != (UVector32 *)0x0) {
      (*(this->data->super_UObject)._vptr_UObject[1])();
    }
    this->data = adopt;
    this->pos = -(uint)(adopt == (UVector32 *)0x0);
  }
  else if (adopt != (UVector32 *)0x0) {
    (*(adopt->super_UObject)._vptr_UObject[1])(adopt);
    return;
  }
  return;
}

Assistant:

void FieldPositionIterator::setData(UVector32 *adopt, UErrorCode& status) {
  // Verify that adopt has valid data, and update status if it doesn't.
  if (U_SUCCESS(status)) {
    if (adopt) {
      if (adopt->size() == 0) {
        delete adopt;
        adopt = NULL;
      } else if ((adopt->size() % 3) != 0) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
      } else {
        for (int i = 1; i < adopt->size(); i += 3) {
          if (adopt->elementAti(i) >= adopt->elementAti(i+1)) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            break;
          }
        }
      }
    }
  }

  // We own the data, even if status is in error, so we need to delete it now
  // if we're not keeping track of it.
  if (!U_SUCCESS(status)) {
    delete adopt;
    return;
  }

  delete data;
  data = adopt;
  pos = adopt == NULL ? -1 : 0;
}